

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_telemetry_messenger.c
# Opt level: O0

STRING_HANDLE create_message_receive_address(STRING_HANDLE devices_and_modules_path)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  char *pcVar3;
  LOGGER_LOG l_1;
  char *devices_and_modules_path_char_ptr;
  LOGGER_LOG l;
  STRING_HANDLE message_receive_address;
  STRING_HANDLE devices_and_modules_path_local;
  
  l = (LOGGER_LOG)STRING_new();
  if ((STRING_HANDLE)l == (STRING_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                ,"create_message_receive_address",0xe6,1,
                "Failed creating the message_receive_address (STRING_new failed)");
    }
  }
  else {
    pcVar3 = STRING_c_str(devices_and_modules_path);
    iVar1 = STRING_sprintf((STRING_HANDLE)l,"amqps://%s/messages/devicebound",pcVar3);
    if (iVar1 != 0) {
      STRING_delete((STRING_HANDLE)l);
      l = (LOGGER_LOG)0x0;
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                  ,"create_message_receive_address",0xef,1,
                  "Failed creating the message_receive_address (STRING_sprintf failed)");
      }
    }
  }
  return (STRING_HANDLE)l;
}

Assistant:

static STRING_HANDLE create_message_receive_address(STRING_HANDLE devices_and_modules_path)
{
    STRING_HANDLE message_receive_address;

    if ((message_receive_address = STRING_new()) == NULL)
    {
        LogError("Failed creating the message_receive_address (STRING_new failed)");
    }
    else
    {
        const char* devices_and_modules_path_char_ptr = STRING_c_str(devices_and_modules_path);
        if (STRING_sprintf(message_receive_address, IOTHUB_MESSAGE_RECEIVE_ADDRESS_FMT, devices_and_modules_path_char_ptr) != RESULT_OK)
        {
            STRING_delete(message_receive_address);
            message_receive_address = NULL;
            LogError("Failed creating the message_receive_address (STRING_sprintf failed)");
        }
    }

    return message_receive_address;
}